

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_highbd_upsample_intra_edge_c(uint16_t *p,int sz,int bd)

{
  uint16_t uVar1;
  int in_ESI;
  long in_RDI;
  int s;
  int i_1;
  int i;
  uint16_t in [19];
  int val;
  int local_3c;
  ushort local_38 [22];
  int local_c;
  long local_8;
  
  local_38[0] = *(ushort *)(in_RDI + -2);
  local_38[1] = *(undefined2 *)(in_RDI + -2);
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_3c = 0; local_3c < local_c; local_3c = local_3c + 1) {
    local_38[local_3c + 2] = *(ushort *)(local_8 + (long)local_3c * 2);
  }
  local_38[local_c + 2] = *(ushort *)(local_8 + (long)(local_c + -1) * 2);
  *(ushort *)(local_8 + -4) = local_38[0];
  for (val = 0; val < local_c; val = val + 1) {
    uVar1 = clip_pixel_highbd(val,(int)(((((uint)local_38[val + 1] * 9 - (uint)local_38[val]) +
                                         (uint)local_38[val + 2] * 9) - (uint)local_38[val + 3]) + 8
                                       ) >> 4);
    *(uint16_t *)(local_8 + (long)(val * 2 + -1) * 2) = uVar1;
    *(ushort *)(local_8 + (long)(val << 1) * 2) = local_38[val + 2];
  }
  return;
}

Assistant:

void av1_highbd_upsample_intra_edge_c(uint16_t *p, int sz, int bd) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint16_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = (s + 8) >> 4;
    s = clip_pixel_highbd(s, bd);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}